

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O3

UBool __thiscall icu_63::AndConstraint::isFulfilled(AndConstraint *this,IFixedDecimal *number)

{
  int iVar1;
  UVector32 *pUVar2;
  int iVar3;
  bool bVar4;
  undefined8 uVar5;
  ulong uVar6;
  double x;
  double dVar7;
  double dVar8;
  
  switch(this->digitsType) {
  case tVariableI:
    uVar5 = 1;
    break;
  case tVariableF:
    uVar5 = 2;
    break;
  case tVariableV:
    uVar5 = 4;
    break;
  case tVariableT:
    uVar5 = 3;
    break;
  default:
    uVar5 = 0;
    if (this->digitsType == none) {
      return '\x01';
    }
  }
  (*number->_vptr_IFixedDecimal[2])(number,uVar5);
  if (this->integerOnly == '\0') {
LAB_0026f206:
    dVar7 = x;
    if (this->op == MOD) {
      dVar7 = fmod(x,(double)this->opNum);
    }
    pUVar2 = this->rangeList;
    if (pUVar2 == (UVector32 *)0x0) {
      bVar4 = dVar7 == (double)this->value || this->value == -1;
      goto LAB_0026f290;
    }
    iVar1 = pUVar2->count;
    if (0 < (long)iVar1) {
      uVar6 = 1;
      do {
        if ((double)pUVar2->elements[uVar6 - 1] <= dVar7) {
          dVar8 = 0.0;
          if (uVar6 < (ulong)(long)iVar1) {
            dVar8 = (double)pUVar2->elements[uVar6];
          }
          if (dVar7 <= dVar8) {
            bVar4 = true;
            goto LAB_0026f290;
          }
        }
        iVar3 = (int)uVar6;
        uVar6 = uVar6 + 2;
      } while (iVar3 + 1 < iVar1);
    }
  }
  else {
    dVar7 = uprv_floor_63(x);
    if ((x == dVar7) && (!NAN(x) && !NAN(dVar7))) goto LAB_0026f206;
  }
  bVar4 = false;
LAB_0026f290:
  return this->negated != '\0' ^ bVar4;
}

Assistant:

UBool
AndConstraint::isFulfilled(const IFixedDecimal &number) {
    UBool result = TRUE;
    if (digitsType == none) {
        // An empty AndConstraint, created by a rule with a keyword but no following expression.
        return TRUE;
    }

    PluralOperand operand = tokenTypeToPluralOperand(digitsType);
    double n = number.getPluralOperand(operand);     // pulls n | i | v | f value for the number.
                                                     // Will always be positive.
                                                     // May be non-integer (n option only)
    do {
        if (integerOnly && n != uprv_floor(n)) {
            result = FALSE;
            break;
        }

        if (op == MOD) {
            n = fmod(n, opNum);
        }
        if (rangeList == nullptr) {
            result = value == -1 ||    // empty rule
                     n == value;       //  'is' rule
            break;
        }
        result = FALSE;                // 'in' or 'within' rule
        for (int32_t r=0; r<rangeList->size(); r+=2) {
            if (rangeList->elementAti(r) <= n && n <= rangeList->elementAti(r+1)) {
                result = TRUE;
                break;
            }
        }
    } while (FALSE);

    if (negated) {
        result = !result;
    }
    return result;
}